

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O2

void ssh2_bpp_free(BinaryPacketProtocol *bpp)

{
  int *s;
  
  s = &bpp[-2].remote_bugs;
  safefree(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
  ssh2_bpp_free_outgoing_crypto((ssh2_bpp_state *)s);
  ssh2_bpp_free_incoming_crypto((ssh2_bpp_state *)s);
  safefree(bpp[-1].out_pq.pqb.end.next);
  safefree(s);
  return;
}

Assistant:

static void ssh2_bpp_free(BinaryPacketProtocol *bpp)
{
    struct ssh2_bpp_state *s = container_of(bpp, struct ssh2_bpp_state, bpp);
    sfree(s->buf);
    ssh2_bpp_free_outgoing_crypto(s);
    ssh2_bpp_free_incoming_crypto(s);
    sfree(s->pktin);
    sfree(s);
}